

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.hpp
# Opt level: O3

bitpacking_width_t
duckdb::BitpackingPrimitives::FindMinimumBitWidth<duckdb::hugeint_t,true,false>
          (hugeint_t min_value,hugeint_t max_value)

{
  bool bVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  hugeint_t value;
  hugeint_t local_58;
  hugeint_t local_48;
  hugeint_t local_38;
  
  local_38.upper = min_value.upper;
  local_38.lower = min_value.lower;
  local_58 = (hugeint_t)(ZEXT816(0x8000000000000000) << 0x40);
  bVar1 = hugeint_t::operator==(&local_38,&local_58);
  bVar2 = 0x80;
  if (!bVar1) {
    local_58 = hugeint_t::operator-(&local_38);
    local_48.lower = max_value.lower;
    local_48.upper = max_value.upper;
    bVar1 = hugeint_t::operator>(&local_58,&local_48);
    uVar7 = (uint)bVar1;
    uVar4 = (int)(uVar7 << 0x1f) >> 0x1f;
    uVar5 = (int)(uVar7 << 0x1f) >> 0x1f;
    uVar6 = (int)(uVar7 << 0x1f) >> 0x1f;
    uVar7 = (int)(uVar7 << 0x1f) >> 0x1f;
    local_58.lower._4_4_ = uVar5 & local_58.lower._4_4_ | ~uVar5 & local_48.lower._4_4_;
    local_58.lower._0_4_ = uVar4 & (uint)local_58.lower | ~uVar4 & (uint)local_48.lower;
    local_58.upper._0_4_ = uVar6 & (uint)local_58.upper | ~uVar6 & (uint)local_48.upper;
    local_58.upper._4_4_ = uVar7 & local_58.upper._4_4_ | ~uVar7 & local_48.upper._4_4_;
    hugeint_t::hugeint_t(&local_48,0);
    bVar1 = hugeint_t::operator==(&local_58,&local_48);
    bVar2 = 0;
    if (!bVar1) {
      bVar1 = hugeint_t::operator_cast_to_bool(&local_58);
      bVar2 = 1;
      if (bVar1) {
        bVar3 = 1;
        do {
          bVar3 = bVar3 + 1;
          hugeint_t::hugeint_t(&local_48,1);
          hugeint_t::operator>>=(&local_58,&local_48);
          bVar1 = hugeint_t::operator_cast_to_bool(&local_58);
        } while (bVar1);
        bVar2 = 0x80;
        if (bVar3 < 0x71) {
          bVar2 = bVar3;
        }
      }
    }
  }
  return bVar2;
}

Assistant:

static bitpacking_width_t FindMinimumBitWidth(T min_value, T max_value) {
		bitpacking_width_t bitwidth;
		T value;

		if (is_signed) {
			if (min_value == NumericLimits<T>::Minimum()) {
				// handle special case of the minimal value, as it cannot be negated like all other values.
				return sizeof(T) * 8;
			} else {
				value = MaxValue((T)-min_value, max_value);
			}
		} else {
			value = max_value;
		}

		if (value == 0) {
			return 0;
		}

		if (is_signed) {
			bitwidth = 1;
		} else {
			bitwidth = 0;
		}

		while (value) {
			bitwidth++;
			value >>= 1;
		}

		bitwidth = GetEffectiveWidth<T>(bitwidth);

		// Assert results are correct
#ifdef DEBUG
		if (bitwidth < sizeof(T) * 8 && bitwidth != 0) {
			if (is_signed) {
				D_ASSERT(max_value <= (T(1) << (bitwidth - 1)) - 1);
				// D_ASSERT(min_value >= (T(-1) * ((T(1) << (bitwidth - 1)) - 1) - 1));
			} else {
				D_ASSERT(max_value <= (T(1) << (bitwidth)) - 1);
			}
		}
#endif
		if (round_to_next_byte) {
			return (bitwidth / 8 + (bitwidth % 8 != 0)) * 8;
		}
		return bitwidth;
	}